

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O1

void nhr_response_add_body_data(nhr_response r,void *data,size_t data_size)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = r->body_len + data_size;
  if (r->body_size < uVar4) {
    pvVar1 = nhr_realloc(r->body,uVar4);
    r->body = pvVar1;
    r->body_size = uVar4;
  }
  memcpy((void *)((long)r->body + r->body_len),data,data_size);
  uVar3 = data_size + r->body_len;
  uVar4 = r->content_length;
  uVar2 = uVar4;
  if (uVar3 < uVar4) {
    uVar2 = uVar3;
  }
  if (uVar4 == 0) {
    uVar2 = uVar3;
  }
  r->body_len = uVar2;
  return;
}

Assistant:

void nhr_response_add_body_data(nhr_response r, void * data, const size_t data_size) {
	const size_t required = r->body_len + data_size;
	char * body = NULL;

	if (required > r->body_size) {
		r->body = nhr_realloc(r->body, required);
		r->body_size = required;
	}

	body = (char *)r->body;
	body += r->body_len;
	memcpy(body, data, data_size);
	r->body_len += data_size;
	nhr_response_fix_body_len(r);
}